

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O2

int cmf4kf_(int *lot,int *ido,int *l1,int *na,double *cc,int *im1,int *in1,double *ch,int *im2,
           int *in2,double *wa)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  uint uVar38;
  int iVar39;
  long lVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  int local_e8;
  int local_ac;
  int local_a8;
  
  uVar3 = *ido;
  uVar30 = (ulong)uVar3;
  iVar35 = uVar3 * 4;
  iVar4 = *in1;
  iVar5 = *l1;
  uVar38 = iVar5 * (uVar3 + 1);
  iVar2 = ~uVar38 * iVar4 * 2 + -3;
  iVar22 = *in2;
  uVar9 = iVar5 * 5;
  iVar28 = ~uVar9 * iVar22 * 2 + -3;
  iVar6 = *im1;
  lVar36 = (long)iVar6;
  lVar34 = ((long)*lot + -1) * lVar36;
  lVar17 = lVar34 + 1;
  iVar7 = *im2;
  iVar32 = (int)lVar34;
  if ((int)uVar3 < 2) {
    dVar41 = 1.0 / (double)(iVar5 * 4);
    iVar15 = uVar3 * 3 + 1;
    local_e8 = (int)lVar17;
    if (*na == 1) {
      iVar14 = 0;
      if (0 < iVar5) {
        iVar14 = iVar5;
      }
      iVar1 = (iVar5 * 8 + 1) * iVar22 * 2;
      iVar8 = (iVar5 * 6 + 1) * iVar22 * 2;
      iVar10 = (iVar5 * 7 + 1) * iVar22 * 2;
      iVar11 = (uVar9 + 1) * iVar22 * 2;
      iVar35 = ((iVar35 + 1) * iVar5 + 1) * iVar4 * 2;
      iVar16 = 0;
      iVar12 = ((uVar3 * 2 + 1) * iVar5 + 1) * iVar4 * 2;
      iVar5 = (iVar15 * iVar5 + 1) * iVar4 * 2;
      iVar15 = (uVar38 + 1) * iVar4 * 2;
      iVar33 = 0;
      for (uVar30 = 1; uVar30 != iVar14 + 1; uVar30 = uVar30 + 1) {
        lVar17 = 1;
        iVar18 = iVar33;
        iVar26 = iVar16;
        while( true ) {
          bVar13 = lVar17 <= local_e8;
          if (iVar6 < 0) {
            bVar13 = iVar32 < lVar17;
          }
          if (!bVar13) break;
          dVar42 = cc[(long)iVar2 + (long)(iVar15 + iVar26 + 2) + 2] -
                   cc[(long)iVar2 + (long)(iVar5 + 2 + iVar26) + 2];
          dVar43 = cc[(long)iVar2 + (long)(iVar15 + iVar26 + 2) + 2] +
                   cc[(long)iVar2 + (long)(iVar5 + 2 + iVar26) + 2];
          dVar44 = cc[(long)iVar2 + (long)(iVar12 + 2 + iVar26) + 2] -
                   cc[(long)iVar2 + (long)(iVar35 + 2 + iVar26) + 2];
          dVar47 = cc[(long)iVar2 + (long)(iVar12 + 2 + iVar26) + 2] +
                   cc[(long)iVar2 + (long)(iVar35 + 2 + iVar26) + 2];
          dVar46 = cc[(long)iVar2 + (long)(iVar15 + 3 + iVar26)] -
                   cc[(long)iVar2 + (long)(iVar5 + 3 + iVar26)];
          dVar48 = cc[(long)iVar2 + (long)(iVar15 + 3 + iVar26)] +
                   cc[(long)iVar2 + (long)(iVar5 + 3 + iVar26)];
          dVar45 = cc[(long)iVar2 + (long)(iVar35 + 3 + iVar26)] -
                   cc[(long)iVar2 + (long)(iVar12 + 3 + iVar26)];
          dVar49 = cc[(long)iVar2 + (long)(iVar35 + 3 + iVar26)] +
                   cc[(long)iVar2 + (long)(iVar12 + 3 + iVar26)];
          ch[(long)iVar28 + (long)(iVar11 + 3 + iVar18)] = (dVar48 + dVar49) * dVar41;
          ch[(long)iVar28 + (long)(iVar10 + 3 + iVar18)] = (dVar48 - dVar49) * dVar41;
          ch[(long)iVar28 + (long)(iVar11 + 2 + iVar18) + 2] = (dVar43 + dVar47) * dVar41;
          ch[(long)iVar28 + (long)(iVar10 + 2 + iVar18) + 2] = (dVar43 - dVar47) * dVar41;
          ch[(long)iVar28 + (long)(iVar8 + 3 + iVar18)] = (dVar44 + dVar46) * dVar41;
          ch[(long)iVar28 + (long)(iVar1 + 3 + iVar18)] = (dVar46 - dVar44) * dVar41;
          ch[(long)iVar28 + (long)(iVar8 + 2 + iVar18) + 2] = (dVar42 + dVar45) * dVar41;
          ch[(long)iVar28 + (long)(iVar1 + 2 + iVar18) + 2] = (dVar42 - dVar45) * dVar41;
          lVar17 = lVar17 + lVar36;
          iVar18 = iVar18 + iVar7 * 2;
          iVar26 = iVar26 + iVar6 * 2;
        }
        iVar33 = iVar33 + iVar22 * 2;
        iVar16 = iVar16 + iVar4 * 2;
      }
    }
    else {
      iVar22 = 0;
      iVar28 = 0;
      if (0 < iVar5) {
        iVar28 = iVar5;
      }
      iVar7 = ((iVar35 + 1) * iVar5 + 1) * iVar4 * 2;
      iVar35 = ((uVar3 * 2 + 1) * iVar5 + 1) * iVar4 * 2;
      iVar5 = (iVar15 * iVar5 + 1) * iVar4 * 2;
      iVar15 = (uVar38 + 1) * iVar4 * 2;
      for (uVar30 = 1; uVar30 != iVar28 + 1; uVar30 = uVar30 + 1) {
        lVar17 = 1;
        iVar14 = iVar22;
        while( true ) {
          bVar13 = lVar17 <= local_e8;
          if (iVar6 < 0) {
            bVar13 = iVar32 < lVar17;
          }
          if (!bVar13) break;
          lVar29 = (long)(iVar15 + iVar14 + 2);
          dVar42 = cc[(long)iVar2 + lVar29 + 2];
          lVar31 = (long)(iVar5 + 2 + iVar14);
          dVar43 = cc[(long)iVar2 + lVar31 + 2];
          lVar37 = (long)(iVar35 + 2 + iVar14);
          dVar44 = cc[(long)iVar2 + lVar37 + 2];
          lVar21 = (long)(iVar7 + 2 + iVar14);
          dVar45 = cc[(long)iVar2 + lVar21 + 2];
          lVar34 = (long)(iVar15 + 3 + iVar14);
          dVar46 = cc[iVar2 + lVar34];
          lVar23 = (long)(iVar5 + 3 + iVar14);
          dVar47 = cc[iVar2 + lVar23];
          dVar50 = dVar46 + dVar47;
          lVar25 = (long)(iVar7 + 3 + iVar14);
          dVar48 = cc[iVar2 + lVar25];
          lVar40 = (long)(iVar35 + 3 + iVar14);
          dVar49 = cc[iVar2 + lVar40];
          dVar51 = dVar48 + dVar49;
          cc[iVar2 + lVar34] = (dVar50 + dVar51) * dVar41;
          cc[iVar2 + lVar23] = (dVar50 - dVar51) * dVar41;
          dVar50 = dVar42 + dVar43;
          dVar51 = dVar44 + dVar45;
          cc[(long)iVar2 + lVar29 + 2] = (dVar50 + dVar51) * dVar41;
          cc[(long)iVar2 + lVar31 + 2] = (dVar50 - dVar51) * dVar41;
          dVar44 = dVar44 - dVar45;
          dVar46 = dVar46 - dVar47;
          cc[iVar2 + lVar40] = (dVar44 + dVar46) * dVar41;
          cc[iVar2 + lVar25] = (dVar46 - dVar44) * dVar41;
          dVar42 = dVar42 - dVar43;
          dVar48 = dVar48 - dVar49;
          cc[(long)iVar2 + lVar37 + 2] = (dVar42 + dVar48) * dVar41;
          cc[(long)iVar2 + lVar21 + 2] = (dVar42 - dVar48) * dVar41;
          lVar17 = lVar17 + lVar36;
          iVar14 = iVar14 + iVar6 * 2;
        }
        iVar22 = iVar22 + iVar4 * 2;
      }
    }
  }
  else {
    iVar14 = uVar3 * 4 + 1;
    iVar15 = 0;
    if (0 < iVar5) {
      iVar15 = iVar5;
    }
    iVar1 = (iVar5 * 8 + 1) * iVar22 * 2;
    iVar7 = iVar7 * 2;
    iVar8 = (iVar5 * 6 + 1) * iVar22 * 2;
    iVar10 = (iVar5 * 7 + 1) * iVar22 * 2;
    iVar11 = (uVar9 + 1) * iVar22 * 2;
    iVar12 = ((iVar35 + 1) * iVar5 + 1) * iVar4 * 2;
    iVar26 = 0;
    iVar16 = ((uVar3 * 2 + 1) * iVar5 + 1) * iVar4 * 2;
    iVar33 = ((uVar3 * 3 + 1) * iVar5 + 1) * iVar4 * 2;
    iVar18 = (uVar38 + 1) * iVar4 * 2;
    iVar39 = 0;
    for (uVar19 = 1; uVar19 != iVar15 + 1; uVar19 = uVar19 + 1) {
      lVar34 = 1;
      iVar20 = iVar26;
      iVar27 = iVar39;
      while( true ) {
        bVar13 = lVar34 <= lVar17;
        if (iVar6 < 0) {
          bVar13 = iVar32 < lVar34;
        }
        if (!bVar13) break;
        dVar41 = cc[(long)iVar2 + (long)(iVar18 + iVar20 + 2) + 2] -
                 cc[(long)iVar2 + (long)(iVar33 + 2 + iVar20) + 2];
        dVar42 = cc[(long)iVar2 + (long)(iVar18 + iVar20 + 2) + 2] +
                 cc[(long)iVar2 + (long)(iVar33 + 2 + iVar20) + 2];
        dVar43 = cc[(long)iVar2 + (long)(iVar16 + 2 + iVar20) + 2] -
                 cc[(long)iVar2 + (long)(iVar12 + 2 + iVar20) + 2];
        dVar44 = cc[(long)iVar2 + (long)(iVar16 + 2 + iVar20) + 2] +
                 cc[(long)iVar2 + (long)(iVar12 + 2 + iVar20) + 2];
        dVar45 = cc[(long)iVar2 + (long)(iVar18 + 3 + iVar20)] -
                 cc[(long)iVar2 + (long)(iVar33 + 3 + iVar20)];
        dVar47 = cc[(long)iVar2 + (long)(iVar18 + 3 + iVar20)] +
                 cc[(long)iVar2 + (long)(iVar33 + 3 + iVar20)];
        dVar46 = cc[(long)iVar2 + (long)(iVar12 + 3 + iVar20)] -
                 cc[(long)iVar2 + (long)(iVar16 + 3 + iVar20)];
        dVar48 = cc[(long)iVar2 + (long)(iVar12 + 3 + iVar20)] +
                 cc[(long)iVar2 + (long)(iVar16 + 3 + iVar20)];
        ch[(long)iVar28 + (long)(iVar11 + 3 + iVar27)] = dVar47 + dVar48;
        ch[(long)iVar28 + (long)(iVar10 + 3 + iVar27)] = dVar47 - dVar48;
        ch[(long)iVar28 + (long)(iVar11 + 2 + iVar27) + 2] = dVar42 + dVar44;
        ch[(long)iVar28 + (long)(iVar10 + 2 + iVar27) + 2] = dVar42 - dVar44;
        ch[(long)iVar28 + (long)(iVar8 + 3 + iVar27)] = dVar43 + dVar45;
        ch[(long)iVar28 + (long)(iVar1 + 3 + iVar27)] = dVar45 - dVar43;
        ch[(long)iVar28 + (long)(iVar8 + 2 + iVar27) + 2] = dVar41 + dVar46;
        ch[(long)iVar28 + (long)(iVar1 + 2 + iVar27) + 2] = dVar41 - dVar46;
        lVar34 = lVar34 + lVar36;
        iVar27 = iVar27 + iVar7;
        iVar20 = iVar20 + iVar6 * 2;
      }
      iVar39 = iVar39 + iVar22 * 2;
      iVar26 = iVar26 + iVar4 * 2;
    }
    iVar8 = (iVar5 * 0xc + 1) * iVar22 * 2;
    iVar10 = (iVar5 * 0xb + 1) * iVar22 * 2;
    iVar11 = (iVar5 * 10 + 1) * iVar22 * 2;
    iVar12 = (iVar5 * 9 + 1) * iVar22 * 2;
    iVar1 = ((iVar35 + 2) * iVar5 + 1) * iVar4 * 2;
    iVar16 = ((uVar3 * 2 + 2) * iVar5 + 1) * iVar4 * 2;
    iVar33 = ((uVar3 * 3 + 2) * iVar5 + 1) * iVar4 * 2;
    iVar18 = ((uVar3 + 2) * iVar5 + 1) * iVar4 * 2;
    local_a8 = 0;
    local_ac = 0;
    for (uVar19 = 2; uVar19 != uVar3 + 1; uVar19 = uVar19 + 1) {
      iVar26 = local_a8;
      iVar39 = local_ac;
      for (uVar24 = 1; uVar24 != iVar15 + 1; uVar24 = uVar24 + 1) {
        lVar34 = 1;
        iVar27 = iVar26;
        iVar20 = iVar39;
        while( true ) {
          bVar13 = lVar34 <= lVar17;
          if (iVar6 < 0) {
            bVar13 = iVar32 < lVar34;
          }
          if (!bVar13) break;
          dVar41 = cc[(long)iVar2 + (long)(iVar18 + iVar27 + 2) + 2] -
                   cc[(long)iVar2 + (long)(iVar33 + 2 + iVar27) + 2];
          dVar42 = cc[(long)iVar2 + (long)(iVar18 + iVar27 + 2) + 2] +
                   cc[(long)iVar2 + (long)(iVar33 + 2 + iVar27) + 2];
          dVar47 = cc[(long)iVar2 + (long)(iVar16 + 2 + iVar27) + 2] +
                   cc[(long)iVar2 + (long)(iVar1 + 2 + iVar27) + 2];
          dVar45 = cc[(long)iVar2 + (long)(iVar16 + 2 + iVar27) + 2] -
                   cc[(long)iVar2 + (long)(iVar1 + 2 + iVar27) + 2];
          dVar43 = cc[(long)iVar2 + (long)(iVar18 + 3 + iVar27)] -
                   cc[(long)iVar2 + (long)(iVar33 + 3 + iVar27)];
          dVar44 = cc[(long)iVar2 + (long)(iVar18 + 3 + iVar27)] +
                   cc[(long)iVar2 + (long)(iVar33 + 3 + iVar27)];
          dVar48 = cc[(long)iVar2 + (long)(iVar1 + 3 + iVar27)] -
                   cc[(long)iVar2 + (long)(iVar16 + 3 + iVar27)];
          dVar46 = cc[(long)iVar2 + (long)(iVar1 + 3 + iVar27)] +
                   cc[(long)iVar2 + (long)(iVar16 + 3 + iVar27)];
          ch[(long)iVar28 + (long)(iVar12 + 3 + iVar20)] = dVar44 + dVar46;
          dVar44 = dVar44 - dVar46;
          ch[(long)iVar28 + (long)(iVar12 + 2 + iVar20) + 2] = dVar42 + dVar47;
          dVar42 = dVar42 - dVar47;
          dVar46 = dVar45 + dVar43;
          dVar43 = dVar43 - dVar45;
          dVar45 = dVar41 + dVar48;
          dVar41 = dVar41 - dVar48;
          ch[(long)iVar28 + (long)(iVar11 + 3 + iVar20)] =
               wa[(long)-iVar14 + uVar19 + (long)iVar35] * dVar46 +
               wa[(long)-iVar14 + uVar30 * 7 + uVar19] * dVar45;
          ch[(long)iVar28 + (long)(iVar11 + 2 + iVar20) + 2] =
               dVar45 * wa[(long)-iVar14 + uVar19 + (long)iVar35] -
               dVar46 * wa[(long)-iVar14 + uVar30 * 7 + uVar19];
          ch[(long)iVar28 + (long)(iVar10 + 3 + iVar20)] =
               wa[(long)-iVar14 + uVar30 * 5 + uVar19] * dVar44 +
               wa[(long)-iVar14 + (long)(int)(uVar3 * 8) + uVar19] * dVar42;
          ch[(long)iVar28 + (long)(iVar10 + 2 + iVar20) + 2] =
               dVar42 * wa[(long)-iVar14 + uVar30 * 5 + uVar19] -
               dVar44 * wa[(long)-iVar14 + (long)(int)(uVar3 * 8) + uVar19];
          ch[(long)iVar28 + (long)(iVar8 + 3 + iVar20)] =
               wa[(long)-iVar14 + uVar30 * 6 + uVar19] * dVar43 +
               wa[(long)-iVar14 + uVar30 * 9 + uVar19] * dVar41;
          ch[(long)iVar28 + (long)(iVar8 + 2 + iVar20) + 2] =
               dVar41 * wa[(long)-iVar14 + uVar30 * 6 + uVar19] -
               dVar43 * wa[(long)-iVar14 + uVar30 * 9 + uVar19];
          lVar34 = lVar34 + lVar36;
          iVar20 = iVar20 + iVar7;
          iVar27 = iVar27 + iVar6 * 2;
        }
        iVar39 = iVar39 + iVar22 * 2;
        iVar26 = iVar26 + iVar4 * 2;
      }
      local_ac = local_ac + iVar22 * iVar5 * 8;
      local_a8 = local_a8 + iVar4 * iVar5 * 2;
    }
  }
  return 0;
}

Assistant:

int cmf4kf_(int *lot, int *ido, int *l1, int
	*na, fft_real_t *cc, int *im1, int *in1, fft_real_t *ch, int *im2,
	int *in2, fft_real_t *wa)
{
    /* System generated locals */
    int cc_dim2, cc_dim3, cc_dim4, cc_offset, ch_dim2, ch_dim3, ch_offset,
	     wa_dim1, wa_offset, i__1, i__2, i__3, i__4;

    /* Local variables */
     int i__, k, m1, m2;
     fft_real_t sn, ci2, ci3, ci4;
     int m1d;
     fft_real_t cr3, cr2, cr4, ti1, ti2, ti3, ti4;
     int m2s;
     fft_real_t tr1, tr2, tr3, tr4;


/* FFTPACK 5.0 auxiliary routine */

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_offset = 1 + (wa_dim1 << 2);
    wa -= wa_offset;
    cc_dim2 = *in1;
    cc_dim3 = *l1;
    cc_dim4 = *ido;
    cc_offset = 1 + 2 * (1 + cc_dim2 * (1 + cc_dim3 * (1 + cc_dim4)));
    cc -= cc_offset;
    ch_dim2 = *in2;
    ch_dim3 = *l1;
    ch_offset = 1 + 2 * (1 + ch_dim2 * (1 + ch_dim3 * 5));
    ch -= ch_offset;

    /* Function Body */
    m1d = (*lot - 1) * *im1 + 1;
    m2s = 1 - *im2;
    if (*ido > 1) {
	goto L102;
    }
    sn = 1.0 / (fft_real_t) (*l1 << 2);
    if (*na == 1) {
	goto L106;
    }
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = m1d;
	i__3 = *im1;
	for (m1 = 1; i__3 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__3) {
	    ti1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    ti2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    tr4 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    tr1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    tr2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    ti4 = cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] - cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1] = sn *
		     (tr2 + tr3);
	    cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1) + 1] =
		    sn * (tr2 - tr3);
	    cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2] = sn *
		     (ti2 + ti3);
	    cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1) + 2] =
		    sn * (ti2 - ti3);
	    cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		     = sn * (tr1 + tr4);
	    cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		     = sn * (tr1 - tr4);
	    cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		     = sn * (ti1 + ti4);
	    cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		     = sn * (ti1 - ti4);
/* L101: */
	}
    }
    return 0;
L106:
    i__3 = *l1;
    for (k = 1; k <= i__3; ++k) {
	m2 = m2s;
	i__2 = m1d;
	i__1 = *im1;
	for (m1 = 1; i__1 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__1) {
	    m2 += *im2;
	    ti1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    ti2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    tr4 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    tr1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    tr2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    ti4 = cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] - cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    ch[(m2 + (k + ch_dim3 * 5) * ch_dim2 << 1) + 1] = sn * (tr2 + tr3)
		    ;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 1] = sn * (tr2 - tr3)
		    ;
	    ch[(m2 + (k + ch_dim3 * 5) * ch_dim2 << 1) + 2] = sn * (ti2 + ti3)
		    ;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 2] = sn * (ti2 - ti3)
		    ;
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 1] = sn * (tr1 + tr4)
		    ;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 1] = sn * (tr1 -
		    tr4);
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 2] = sn * (ti1 + ti4)
		    ;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 2] = sn * (ti1 -
		    ti4);
/* L107: */
	}
    }
    return 0;
L102:
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	m2 = m2s;
	i__2 = m1d;
	i__3 = *im1;
	for (m1 = 1; i__3 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__3) {
	    m2 += *im2;
	    ti1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    ti2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    tr4 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    tr1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    tr2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    ti4 = cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] - cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    ch[(m2 + (k + ch_dim3 * 5) * ch_dim2 << 1) + 1] = tr2 + tr3;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 1] = tr2 - tr3;
	    ch[(m2 + (k + ch_dim3 * 5) * ch_dim2 << 1) + 2] = ti2 + ti3;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 2] = ti2 - ti3;
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 1] = tr1 + tr4;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 1] = tr1 - tr4;
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 2] = ti1 + ti4;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 2] = ti1 - ti4;
/* L103: */
	}
    }
    i__3 = *ido;
    for (i__ = 2; i__ <= i__3; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    m2 = m2s;
	    i__1 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__1 : m1 <= i__1; m1 += i__4) {
		m2 += *im2;
		ti1 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 2] - cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) *
			 cc_dim2 << 1) + 2];
		ti2 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 2] + cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) *
			 cc_dim2 << 1) + 2];
		ti3 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 2] + cc[(m1 + (k + (i__ + (cc_dim4 <<
			2)) * cc_dim3) * cc_dim2 << 1) + 2];
		tr4 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 2] - cc[(m1 + (k + (i__ + (cc_dim4 <<
			2)) * cc_dim3) * cc_dim2 << 1) + 2];
		tr1 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 1] - cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) *
			 cc_dim2 << 1) + 1];
		tr2 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 1] + cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) *
			 cc_dim2 << 1) + 1];
		ti4 = cc[(m1 + (k + (i__ + (cc_dim4 << 2)) * cc_dim3) *
			cc_dim2 << 1) + 1] - cc[(m1 + (k + (i__ + (cc_dim4 <<
			1)) * cc_dim3) * cc_dim2 << 1) + 1];
		tr3 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 1] + cc[(m1 + (k + (i__ + (cc_dim4 <<
			2)) * cc_dim3) * cc_dim2 << 1) + 1];
		ch[(m2 + (k + ((i__ << 2) + 1) * ch_dim3) * ch_dim2 << 1) + 1]
			 = tr2 + tr3;
		cr3 = tr2 - tr3;
		ch[(m2 + (k + ((i__ << 2) + 1) * ch_dim3) * ch_dim2 << 1) + 2]
			 = ti2 + ti3;
		ci3 = ti2 - ti3;
		cr2 = tr1 + tr4;
		cr4 = tr1 - tr4;
		ci2 = ti1 + ti4;
		ci4 = ti1 - ti4;
		ch[(m2 + (k + ((i__ << 2) + 2) * ch_dim3) * ch_dim2 << 1) + 1]
			 = wa[i__ + (wa_dim1 << 2)] * cr2 + wa[i__ + wa_dim1 *
			 7] * ci2;
		ch[(m2 + (k + ((i__ << 2) + 2) * ch_dim3) * ch_dim2 << 1) + 2]
			 = wa[i__ + (wa_dim1 << 2)] * ci2 - wa[i__ + wa_dim1 *
			 7] * cr2;
		ch[(m2 + (k + ((i__ << 2) + 3) * ch_dim3) * ch_dim2 << 1) + 1]
			 = wa[i__ + wa_dim1 * 5] * cr3 + wa[i__ + (wa_dim1 <<
			3)] * ci3;
		ch[(m2 + (k + ((i__ << 2) + 3) * ch_dim3) * ch_dim2 << 1) + 2]
			 = wa[i__ + wa_dim1 * 5] * ci3 - wa[i__ + (wa_dim1 <<
			3)] * cr3;
		ch[(m2 + (k + ((i__ << 2) + 4) * ch_dim3) * ch_dim2 << 1) + 1]
			 = wa[i__ + wa_dim1 * 6] * cr4 + wa[i__ + wa_dim1 * 9]
			 * ci4;
		ch[(m2 + (k + ((i__ << 2) + 4) * ch_dim3) * ch_dim2 << 1) + 2]
			 = wa[i__ + wa_dim1 * 6] * ci4 - wa[i__ + wa_dim1 * 9]
			 * cr4;
/* L104: */
	    }
	}
/* L105: */
    }
    return 0;
}